

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O3

void adapt::cuf::detail::WriteUnsignedInt<double>(ostringstream *str,double *arg,char mod)

{
  undefined8 *puVar1;
  int iVar2;
  undefined7 in_register_00000011;
  char local_1;
  
  iVar2 = (int)CONCAT71(in_register_00000011,mod);
  if (iVar2 < 0x67) {
    if (iVar2 != 0) {
      if (iVar2 == 0x3f) goto switchD_0010bd20_caseD_6d;
      goto switchD_0010bd20_caseD_69;
    }
  }
  else {
    switch(iVar2) {
    case 0x67:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)str,&local_1,1);
      return;
    case 0x68:
      break;
    case 0x69:
    case 0x6a:
    case 0x6b:
switchD_0010bd20_caseD_69:
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = std::__cxx11::string::pop_back;
      __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
    case 0x6d:
switchD_0010bd20_caseD_6d:
      std::ostream::_M_insert<unsigned_long_long>((ulonglong)str);
      return;
    default:
      if (iVar2 != 0x7a) goto switchD_0010bd20_caseD_69;
    case 0x6c:
    }
  }
  std::ostream::_M_insert<unsigned_long>((ulong)str);
  return;
}

Assistant:

void WriteUnsignedInt(std::ostringstream& str, const Value& arg, char mod)
{
	switch (mod)
	{
	case 'z': Write<std::size_t>(str, arg); break;
	case 'm': Write<unsigned long long>(str, arg); break;
	case 'l': Write<unsigned long>(str, arg); break;
	case 0: Write<unsigned int>(str, arg); break;
	case 'h': Write<unsigned short>(str, arg); break;
	case 'g': Write<unsigned char>(str, arg); break;
	case '?': WriteAnyUnsignedInt(str, arg); break;
	default: throw std::exception(); break;
	}
}